

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_relay.cpp
# Opt level: O3

void __thiscall TCPRelay::HandleEvent(TCPRelay *this,SOCKET s,int event)

{
  int iVar1;
  TCPRelayHandler *this_00;
  _Base_ptr p_Var2;
  mapped_type *ppIVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  uint local_3c;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  local_3c = s;
  if (s == -1) {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_38,local_30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [warning] ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"invalid socket\n",0xf)
    ;
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  else if (this->server_socket_ == s) {
    if ((event & 8U) != 0) {
      EventLoop::Stop(this->event_loop_);
      return;
    }
    iVar1 = accept(s,(sockaddr *)0x0,(socklen_t *)0x0);
    if (iVar1 != -1) {
      this_00 = (TCPRelayHandler *)operator_new(0xd0);
      TCPRelayHandler::TCPRelayHandler
                (this_00,this,this->event_loop_,this->dns_resolver_,iVar1,this->config_,
                 this->is_local_);
    }
  }
  else {
    p_Var2 = (this->socket_handler_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var2 != (_Base_ptr)0x0) {
      p_Var5 = &(this->socket_handler_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = &p_Var5->_M_header;
      do {
        if (s <= (int)p_Var2[1]._M_color) {
          p_Var4 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < s];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var4 != p_Var5) && ((int)p_Var4[1]._M_color <= s)) {
        ppIVar3 = std::
                  map<int,_ISockNotify_*,_std::less<int>,_std::allocator<std::pair<const_int,_ISockNotify_*>_>_>
                  ::operator[](&this->socket_handler_,(key_type_conflict *)&local_3c);
        (*(*ppIVar3)->_vptr_ISockNotify[2])(*ppIVar3,(ulong)local_3c,(ulong)(uint)event);
      }
    }
  }
  return;
}

Assistant:

void TCPRelay::HandleEvent(SOCKET s, int event)
{
    if (s == INVALID_SOCKET)
    {
        LOGW << "invalid socket\n";
        return;
    }
    if (s == server_socket_)
    {
        if (event & kPollErr)
        {
            event_loop_->Stop();
            return;
        }
        SOCKET new_socket = accept(server_socket_, NULL, NULL);
        if (new_socket != INVALID_SOCKET)
        {
            new TCPRelayHandler(this, event_loop_, dns_resolver_, new_socket, config_, is_local_);
        }
    }
    else
    {
        if (socket_handler_.count(s) > 0)
        {
            socket_handler_[s]->HandleEvent(s, event);
        }
    }
}